

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> *
split<int>(vector<int,_std::allocator<int>_> *__return_storage_ptr__,string *s,char delim,
          function<int_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          *transform)

{
  pointer pcVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  istream *piVar5;
  undefined7 in_register_00000011;
  pointer pcVar6;
  string *__it;
  size_type sVar7;
  long lVar8;
  pointer pcVar9;
  pointer local_230;
  undefined4 local_224;
  pointer local_220;
  pointer local_218;
  string item;
  pointer local_1f0;
  pointer local_1e8;
  pointer local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream ss;
  
  local_224 = (undefined4)CONCAT71(in_register_00000011,delim);
  pcVar1 = (s->_M_dataplus)._M_p;
  sVar7 = s->_M_string_length;
  local_220 = pcVar1 + sVar7;
  __it = s;
  for (lVar8 = (long)sVar7 >> 2; pcVar6 = pcVar1 + sVar7, pcVar9 = pcVar6, 0 < lVar8;
      lVar8 = lVar8 + -1) {
    _ss = pcVar6;
    bVar3 = __gnu_cxx::__ops::_Iter_pred<trim(std::__cxx11::string&)::{lambda(int)#1}>::operator()
                      ((_Iter_pred<trim(std::__cxx11::string&)::_lambda(int)_1_> *)&ss,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)__it);
    if (bVar3) goto LAB_00120826;
    item._M_dataplus._M_p = pcVar1 + (sVar7 - 1);
    bVar3 = __gnu_cxx::__ops::_Iter_pred<trim(std::__cxx11::string&)::{lambda(int)#1}>::operator()
                      ((_Iter_pred<trim(std::__cxx11::string&)::_lambda(int)_1_> *)&item,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)__it);
    pcVar9 = pcVar1 + (sVar7 - 1);
    if (bVar3) goto LAB_00120826;
    local_230 = pcVar1 + (sVar7 - 2);
    bVar3 = __gnu_cxx::__ops::_Iter_pred<trim(std::__cxx11::string&)::{lambda(int)#1}>::operator()
                      ((_Iter_pred<trim(std::__cxx11::string&)::_lambda(int)_1_> *)&local_230,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)__it);
    pcVar9 = pcVar1 + (sVar7 - 2);
    if (bVar3) goto LAB_00120826;
    local_218 = pcVar1 + (sVar7 - 3);
    bVar3 = __gnu_cxx::__ops::_Iter_pred<trim(std::__cxx11::string&)::{lambda(int)#1}>::operator()
                      ((_Iter_pred<trim(std::__cxx11::string&)::_lambda(int)_1_> *)&local_218,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)__it);
    pcVar9 = pcVar1 + (sVar7 - 3);
    if (bVar3) goto LAB_00120826;
    sVar7 = sVar7 - 4;
  }
  if (sVar7 == 3) {
    local_1e0 = pcVar6;
    bVar3 = __gnu_cxx::__ops::_Iter_pred<trim(std::__cxx11::string&)::{lambda(int)#1}>::operator()
                      ((_Iter_pred<trim(std::__cxx11::string&)::_lambda(int)_1_> *)&local_1e0,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)__it);
    if (bVar3) goto LAB_00120826;
    pcVar6 = pcVar1 + 2;
LAB_0012091f:
    local_1e8 = pcVar6;
    bVar3 = __gnu_cxx::__ops::_Iter_pred<trim(std::__cxx11::string&)::{lambda(int)#1}>::operator()
                      ((_Iter_pred<trim(std::__cxx11::string&)::_lambda(int)_1_> *)&local_1e8,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)__it);
    pcVar9 = pcVar6;
    if (bVar3) goto LAB_00120826;
    pcVar6 = pcVar6 + -1;
  }
  else {
    if (sVar7 == 2) goto LAB_0012091f;
    pcVar9 = pcVar1;
    if (sVar7 != 1) goto LAB_00120826;
  }
  local_1f0 = pcVar6;
  bVar3 = __gnu_cxx::__ops::_Iter_pred<trim(std::__cxx11::string&)::{lambda(int)#1}>::operator()
                    ((_Iter_pred<trim(std::__cxx11::string&)::_lambda(int)_1_> *)&local_1f0,
                     (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)__it);
  pcVar9 = pcVar1;
  if (bVar3) {
    pcVar9 = pcVar6;
  }
LAB_00120826:
  std::__cxx11::string::erase(s,pcVar9,local_220);
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)s,_S_out|_S_in);
  item._M_dataplus._M_p = (pointer)&item.field_2;
  item._M_string_length = 0;
  item.field_2._M_local_buf[0] = '\0';
  cVar2 = (char)local_224;
  while (piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                            ((istream *)&ss,(string *)&item,cVar2),
        ((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0) {
    std::__cxx11::string::string((string *)&local_1d8,(string *)&item);
    iVar4 = std::
            function<int_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
            ::operator()(transform,&local_1d8);
    local_230 = (pointer)CONCAT44(local_230._4_4_,iVar4);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (__return_storage_ptr__,(int *)&local_230);
    std::__cxx11::string::~string((string *)&local_1d8);
  }
  std::__cxx11::string::~string((string *)&item);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::vector<t> split(std::string& s, char delim, const std::function<t(std::string)>& transform) {
	trim(s);
	std::vector<t> elems;
	std::stringstream ss(s);
	std::string item;
	while (std::getline(ss, item, delim)){ elems.push_back(transform(item)); }
	return elems;
}